

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O2

int ProcessStandardArguments(ImportData *fill,char **params,uint num)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  char *pcVar4;
  ulong uVar5;
  allocator<char> local_59;
  string *local_58;
  string local_50 [32];
  
  local_58 = (string *)&fill->logFile;
  uVar5 = 0;
  do {
    if (num == uVar5) {
      if ((((fill->logFile)._M_string_length != 0) || (fill->showLog != false)) ||
         (fill->verbose == true)) {
        fill->log = true;
      }
      return 0;
    }
    pcVar4 = params[uVar5];
    printf("param = %s\n",pcVar4);
    iVar3 = strcmp(pcVar4,"-ptv");
    if (iVar3 == 0) {
LAB_00308279:
      pbVar1 = (byte *)((long)&fill->ppFlags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    else {
      iVar3 = strcmp(pcVar4,"--pretransform-vertices");
      if (iVar3 == 0) goto LAB_00308279;
      iVar3 = strcmp(pcVar4,"-gsn");
      if (iVar3 == 0) {
LAB_00308282:
        *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x40;
      }
      else {
        iVar3 = strcmp(pcVar4,"--gen-smooth-normals");
        if (iVar3 == 0) goto LAB_00308282;
        iVar3 = strcmp(pcVar4,"-dn");
        if (iVar3 == 0) {
LAB_0030828a:
          pbVar1 = (byte *)((long)&fill->ppFlags + 3);
          *pbVar1 = *pbVar1 | 0x40;
        }
        else {
          iVar3 = strcmp(pcVar4,"--drop-normals");
          if (iVar3 == 0) goto LAB_0030828a;
          iVar3 = strcmp(pcVar4,"-gn");
          if (iVar3 == 0) {
LAB_00308293:
            *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x20;
          }
          else {
            iVar3 = strcmp(pcVar4,"--gen-normals");
            if (iVar3 == 0) goto LAB_00308293;
            iVar3 = strcmp(pcVar4,"-jiv");
            if (iVar3 == 0) {
LAB_0030829b:
              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 2;
            }
            else {
              iVar3 = strcmp(pcVar4,"--join-identical-vertices");
              if (iVar3 == 0) goto LAB_0030829b;
              iVar3 = strcmp(pcVar4,"-rrm");
              if (iVar3 == 0) {
LAB_003082a3:
                pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                *pbVar1 = *pbVar1 | 0x10;
              }
              else {
                iVar3 = strcmp(pcVar4,"--remove-redundant-materials");
                if (iVar3 == 0) goto LAB_003082a3;
                iVar3 = strcmp(pcVar4,"-fd");
                if (iVar3 == 0) {
LAB_003082ac:
                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                  *pbVar1 = *pbVar1 | 1;
                }
                else {
                  iVar3 = strcmp(pcVar4,"--find-degenerates");
                  if (iVar3 == 0) goto LAB_003082ac;
                  iVar3 = strcmp(pcVar4,"-slm");
                  if (iVar3 == 0) {
LAB_003082b2:
                    *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 0x80;
                  }
                  else {
                    iVar3 = strcmp(pcVar4,"--split-large-meshes");
                    if (iVar3 == 0) goto LAB_003082b2;
                    iVar3 = strcmp(pcVar4,"-lbw");
                    if (iVar3 == 0) {
LAB_003082b7:
                      pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                      *pbVar1 = *pbVar1 | 2;
                    }
                    else {
                      iVar3 = strcmp(pcVar4,"--limit-bone-weights");
                      if (iVar3 == 0) goto LAB_003082b7;
                      iVar3 = strcmp(pcVar4,"-vds");
                      if (iVar3 == 0) {
LAB_003082bd:
                        pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                        *pbVar1 = *pbVar1 | 4;
                      }
                      else {
                        iVar3 = strcmp(pcVar4,"--validate-data-structure");
                        if (iVar3 == 0) goto LAB_003082bd;
                        iVar3 = strcmp(pcVar4,"-icl");
                        if (iVar3 == 0) {
LAB_003082c3:
                          pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                          *pbVar1 = *pbVar1 | 8;
                        }
                        else {
                          iVar3 = strcmp(pcVar4,"--improve-cache-locality");
                          if (iVar3 == 0) goto LAB_003082c3;
                          iVar3 = strcmp(pcVar4,"-sbpt");
                          if (iVar3 == 0) {
LAB_003082c9:
                            pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                            *pbVar1 = *pbVar1 | 0x80;
                          }
                          else {
                            iVar3 = strcmp(pcVar4,"--sort-by-ptype");
                            if (iVar3 == 0) goto LAB_003082c9;
                            iVar3 = strcmp(pcVar4,"-lh");
                            if (iVar3 == 0) {
LAB_003082cf:
                              fill->ppFlags = fill->ppFlags | 0x1800004;
                            }
                            else {
                              iVar3 = strcmp(pcVar4,"--left-handed");
                              if (iVar3 == 0) goto LAB_003082cf;
                              iVar3 = strcmp(pcVar4,"-fuv");
                              if (iVar3 == 0) {
LAB_003082d7:
                                pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                *pbVar1 = *pbVar1 | 0x80;
                              }
                              else {
                                iVar3 = strcmp(pcVar4,"--flip-uv");
                                if (iVar3 == 0) goto LAB_003082d7;
                                iVar3 = strcmp(pcVar4,"-fwo");
                                if (iVar3 == 0) {
LAB_003082dd:
                                  pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                  *pbVar1 = *pbVar1 | 1;
                                }
                                else {
                                  iVar3 = strcmp(pcVar4,"--flip-winding-order");
                                  if (iVar3 == 0) goto LAB_003082dd;
                                  iVar3 = strcmp(pcVar4,"-tuv");
                                  if (iVar3 == 0) {
LAB_003082e3:
                                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                    *pbVar1 = *pbVar1 | 8;
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar4,"--transform-uv-coords");
                                    if (iVar3 == 0) goto LAB_003082e3;
                                    iVar3 = strcmp(pcVar4,"-guv");
                                    if (iVar3 == 0) {
LAB_003082e9:
                                      pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                      *pbVar1 = *pbVar1 | 4;
                                    }
                                    else {
                                      iVar3 = strcmp(pcVar4,"--gen-uvcoords");
                                      if (iVar3 == 0) goto LAB_003082e9;
                                      iVar3 = strcmp(pcVar4,"-fid");
                                      if (iVar3 == 0) {
LAB_003082ef:
                                        pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                        *pbVar1 = *pbVar1 | 2;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar4,"--find-invalid-data");
                                        if (iVar3 == 0) goto LAB_003082ef;
                                        iVar3 = strcmp(pcVar4,"-fixn");
                                        if (iVar3 == 0) {
LAB_003082f5:
                                          pbVar1 = (byte *)((long)&fill->ppFlags + 1);
                                          *pbVar1 = *pbVar1 | 0x20;
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar4,"--fix-normals");
                                          if (iVar3 == 0) goto LAB_003082f5;
                                          iVar3 = strcmp(pcVar4,"-tri");
                                          if (iVar3 == 0) {
LAB_003082fb:
                                            *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 8;
                                          }
                                          else {
                                            iVar3 = strcmp(pcVar4,"--triangulate");
                                            if (iVar3 == 0) goto LAB_003082fb;
                                            iVar3 = strcmp(pcVar4,"-cts");
                                            if (iVar3 == 0) {
LAB_00308300:
                                              *(byte *)&fill->ppFlags = (byte)fill->ppFlags | 1;
                                            }
                                            else {
                                              iVar3 = strcmp(pcVar4,"--calc-tangent-space");
                                              if (iVar3 == 0) goto LAB_00308300;
                                              iVar3 = strcmp(pcVar4,"-fi");
                                              if (iVar3 == 0) {
LAB_00308305:
                                                pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                *pbVar1 = *pbVar1 | 0x10;
                                              }
                                              else {
                                                iVar3 = strcmp(pcVar4,"--find-instances");
                                                if (iVar3 == 0) goto LAB_00308305;
                                                iVar3 = strcmp(pcVar4,"-og");
                                                if (iVar3 == 0) {
LAB_0030830b:
                                                  pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                  *pbVar1 = *pbVar1 | 0x40;
                                                }
                                                else {
                                                  iVar3 = strcmp(pcVar4,"--optimize-graph");
                                                  if (iVar3 == 0) goto LAB_0030830b;
                                                  iVar3 = strcmp(pcVar4,"-om");
                                                  if (iVar3 == 0) {
LAB_00308311:
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 2);
                                                    *pbVar1 = *pbVar1 | 0x20;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar4,"--optimize-meshes");
                                                    if (iVar3 == 0) goto LAB_00308311;
                                                    iVar3 = strcmp(pcVar4,"-db");
                                                    if (iVar3 == 0) {
LAB_00308317:
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                      *pbVar1 = *pbVar1 | 4;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar4,"--debone");
                                                      if (iVar3 == 0) goto LAB_00308317;
                                                      iVar3 = strcmp(pcVar4,"-sbc");
                                                      if (iVar3 == 0) {
LAB_0030831d:
                                                        pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                        *pbVar1 = *pbVar1 | 2;
                                                      }
                                                      else {
                                                        iVar3 = strcmp(pcVar4,
                                                  "--split-by-bone-count");
                                                  if (iVar3 == 0) goto LAB_0030831d;
                                                  iVar3 = strcmp(pcVar4,"-embtex");
                                                  if (iVar3 == 0) {
LAB_00308323:
                                                    pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                    *pbVar1 = *pbVar1 | 0x10;
                                                  }
                                                  else {
                                                    iVar3 = strcmp(pcVar4,"--embed-textures");
                                                    if (iVar3 == 0) goto LAB_00308323;
                                                    iVar3 = strcmp(pcVar4,"-gs");
                                                    if (iVar3 == 0) {
LAB_00308329:
                                                      pbVar1 = (byte *)((long)&fill->ppFlags + 3);
                                                      *pbVar1 = *pbVar1 | 8;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar4,"--global-scale");
                                                      if (iVar3 == 0) goto LAB_00308329;
                                                      cVar2 = *pcVar4;
                                                      if ((cVar2 == '-') && (pcVar4[1] == 'c')) {
LAB_00308335:
                                                        if (params[uVar5][1] == '-') {
                                                          pcVar4 = pcVar4 + 9;
                                                        }
                                                        else {
                                                          pcVar4 = pcVar4 + 2;
                                                        }
                                                        iVar3 = strncmp(pcVar4,"full",4);
                                                        if (iVar3 == 0) {
                                                          fill->ppFlags = fill->ppFlags | 0x379ecb;
                                                        }
                                                        else {
                                                          iVar3 = strncmp(pcVar4,"default",7);
                                                          if (iVar3 == 0) {
                                                            fill->ppFlags = fill->ppFlags | 0x79acb;
                                                          }
                                                          else {
                                                            iVar3 = strncmp(pcVar4,"fast",4);
                                                            if (iVar3 == 0) {
                                                              fill->ppFlags =
                                                                   fill->ppFlags | 0x4802b;
                                                            }
                                                          }
                                                        }
                                                      }
                                                      else {
                                                        iVar3 = strncmp(pcVar4,"--config=",9);
                                                        if (iVar3 == 0) goto LAB_00308335;
                                                        if (((cVar2 == '-') && (pcVar4[1] == 'l'))
                                                           && (pcVar4[2] == '\0')) {
LAB_00308393:
                                                          fill->showLog = true;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar4,"--show-log");
                                                          if (iVar3 == 0) goto LAB_00308393;
                                                          if (((cVar2 == '-') && (pcVar4[1] == 'v'))
                                                             && (pcVar4[2] == '\0')) {
LAB_003083a9:
                                                            fill->verbose = true;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar4,"--verbose");
                                                            if (iVar3 == 0) goto LAB_003083a9;
                                                            iVar3 = strncmp(pcVar4,"--log-out=",10);
                                                            if ((iVar3 == 0) ||
                                                               (((cVar2 == '-' && (pcVar4[1] == 'l')
                                                                 ) && (pcVar4[2] == 'o')))) {
                                                              pcVar4 = params[uVar5];
                                                              if (pcVar4[1] == '-') {
                                                                pcVar4 = pcVar4 + 10;
                                                              }
                                                              else {
                                                                pcVar4 = pcVar4 + 3;
                                                              }
                                                              std::__cxx11::string::
                                                              string<std::allocator<char>>
                                                                        (local_50,pcVar4,&local_59);
                                                              std::__cxx11::string::operator=
                                                                        (local_58,local_50);
                                                              std::__cxx11::string::~string
                                                                        (local_50);
                                                              if ((fill->logFile)._M_string_length
                                                                  == 0) {
                                                                std::__cxx11::string::assign
                                                                          ((char *)local_58);
                                                              }
                                                            }
                                                          }
                                                        }
                                                      }
                                                    }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int ProcessStandardArguments(
	ImportData& fill, 
	const char* const * params,
	unsigned int num)
{
	// -ptv    --pretransform-vertices
	// -gsn    --gen-smooth-normals
	// -gn     --gen-normals
	// -cts    --calc-tangent-space
	// -jiv    --join-identical-vertices
	// -rrm    --remove-redundant-materials
	// -fd     --find-degenerates
	// -slm    --split-large-meshes
	// -lbw    --limit-bone-weights
	// -vds    --validate-data-structure
	// -icl    --improve-cache-locality
	// -sbpt   --sort-by-ptype
	// -lh     --convert-to-lh
	// -fuv    --flip-uv
	// -fwo    --flip-winding-order
	// -tuv    --transform-uv-coords
	// -guv    --gen-uvcoords
	// -fid    --find-invalid-data
	// -fixn   --fix normals
	// -tri    --triangulate
	// -fi     --find-instances
	// -og     --optimize-graph
	// -om     --optimize-meshes
	// -db     --debone
	// -sbc    --split-by-bone-count
	// -gs	   --global-scale
	//
	// -c<file> --config-file=<file>

	for (unsigned int i = 0; i < num;++i) 
	{
        const char *param = params[ i ];
        printf( "param = %s\n", param );
		if (! strcmp( param, "-ptv") || ! strcmp( param, "--pretransform-vertices")) {
			fill.ppFlags |= aiProcess_PreTransformVertices;
		}
		else if (! strcmp( param, "-gsn") || ! strcmp( param, "--gen-smooth-normals")) {
			fill.ppFlags |= aiProcess_GenSmoothNormals;
		}
    else if (! strcmp( param, "-dn") || ! strcmp( param, "--drop-normals")) {
			fill.ppFlags |= aiProcess_DropNormals;
		}
		else if (! strcmp( param, "-gn") || ! strcmp( param, "--gen-normals")) {
			fill.ppFlags |= aiProcess_GenNormals;
		}
		else if (! strcmp( param, "-jiv") || ! strcmp( param, "--join-identical-vertices")) {
			fill.ppFlags |= aiProcess_JoinIdenticalVertices;
		}
		else if (! strcmp( param, "-rrm") || ! strcmp( param, "--remove-redundant-materials")) {
			fill.ppFlags |= aiProcess_RemoveRedundantMaterials;
		}
		else if (! strcmp( param, "-fd") || ! strcmp( param, "--find-degenerates")) {
			fill.ppFlags |= aiProcess_FindDegenerates;
		}
		else if (! strcmp( param, "-slm") || ! strcmp( param, "--split-large-meshes")) {
			fill.ppFlags |= aiProcess_SplitLargeMeshes;
		}
		else if (! strcmp( param, "-lbw") || ! strcmp( param, "--limit-bone-weights")) {
			fill.ppFlags |= aiProcess_LimitBoneWeights;
		}
		else if (! strcmp( param, "-vds") || ! strcmp( param, "--validate-data-structure")) {
			fill.ppFlags |= aiProcess_ValidateDataStructure;
		}
		else if (! strcmp( param, "-icl") || ! strcmp( param, "--improve-cache-locality")) {
			fill.ppFlags |= aiProcess_ImproveCacheLocality;
		}
		else if (! strcmp( param, "-sbpt") || ! strcmp( param, "--sort-by-ptype")) {
			fill.ppFlags |= aiProcess_SortByPType;
		}
		else if (! strcmp( param, "-lh") || ! strcmp( param, "--left-handed")) {
			fill.ppFlags |= aiProcess_ConvertToLeftHanded;
		}
		else if (! strcmp( param, "-fuv") || ! strcmp( param, "--flip-uv")) {
			fill.ppFlags |= aiProcess_FlipUVs;
		}
		else if (! strcmp( param, "-fwo") || ! strcmp( param, "--flip-winding-order")) {
			fill.ppFlags |= aiProcess_FlipWindingOrder;
		}
		else if (! strcmp( param, "-tuv") || ! strcmp( param, "--transform-uv-coords")) {
			fill.ppFlags |= aiProcess_TransformUVCoords;
		}
		else if (! strcmp( param, "-guv") || ! strcmp( param, "--gen-uvcoords")) {
			fill.ppFlags |= aiProcess_GenUVCoords;
		}
		else if (! strcmp( param, "-fid") || ! strcmp( param, "--find-invalid-data")) {
			fill.ppFlags |= aiProcess_FindInvalidData;
		}
		else if (! strcmp( param, "-fixn") || ! strcmp( param, "--fix-normals")) {
			fill.ppFlags |= aiProcess_FixInfacingNormals;
		}
		else if (! strcmp( param, "-tri") || ! strcmp( param, "--triangulate")) {
			fill.ppFlags |= aiProcess_Triangulate;
		}
		else if (! strcmp( param, "-cts") || ! strcmp( param, "--calc-tangent-space")) {
			fill.ppFlags |= aiProcess_CalcTangentSpace;
		}
		else if (! strcmp( param, "-fi") || ! strcmp( param, "--find-instances")) {
			fill.ppFlags |= aiProcess_FindInstances;
		}
		else if (! strcmp( param, "-og") || ! strcmp( param, "--optimize-graph")) {
			fill.ppFlags |= aiProcess_OptimizeGraph;
		}
		else if (! strcmp( param, "-om") || ! strcmp( param, "--optimize-meshes")) {
			fill.ppFlags |= aiProcess_OptimizeMeshes;
		}
		else if (! strcmp( param, "-db") || ! strcmp( param, "--debone")) {
			fill.ppFlags |= aiProcess_Debone;
		}
		else if (! strcmp( param, "-sbc") || ! strcmp( param, "--split-by-bone-count")) {
			fill.ppFlags |= aiProcess_SplitByBoneCount;
		}
		else if (!strcmp(param, "-embtex") || ! strcmp(param, "--embed-textures")) {
			fill.ppFlags |= aiProcess_EmbedTextures;
		}
		else if (!strcmp(param, "-gs") || ! strcmp(param, "--global-scale")) {
			fill.ppFlags |= aiProcess_GlobalScale;
		}
		else if (! strncmp( param, "-c",2) || ! strncmp( param, "--config=",9)) {
			const unsigned int ofs = (params[i][1] == '-' ? 9 : 2);

			// use default configurations
            if (!strncmp( param + ofs, "full", 4 )) {
                fill.ppFlags |= aiProcessPreset_TargetRealtime_MaxQuality;
            } else if (!strncmp( param + ofs, "default", 7 )) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Quality;
			} else if (! strncmp( param +ofs,"fast",4)) {
				fill.ppFlags |= aiProcessPreset_TargetRealtime_Fast;
			}
		} else if (! strcmp( param, "-l") || ! strcmp( param, "--show-log")) {
			fill.showLog = true;
		}
		else if (! strcmp( param, "-v") || ! strcmp( param, "--verbose")) {
			fill.verbose = true;
		}
		else if (! strncmp( param, "--log-out=",10) || ! strncmp( param, "-lo",3)) {
			fill.logFile = std::string(params[i]+(params[i][1] == '-' ? 10 : 3));
			if (!fill.logFile.length()) {
				fill.logFile = "assimp-log.txt";
			}
		}
	}

	if (fill.logFile.length() || fill.showLog || fill.verbose) {
		fill.log = true;
	}

	return 0;
}